

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

int whisper_tokenize(whisper_context *ctx,char *text,whisper_token *tokens,int n_max_tokens)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint in_ECX;
  long in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int i;
  vector<int,_std::allocator<int>_> res;
  string *in_stack_00000110;
  whisper_vocab *in_stack_00000118;
  int local_7c;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> local_40;
  uint local_24;
  long local_20;
  int local_4;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  tokenize(in_stack_00000118,in_stack_00000110);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  uVar1 = local_24;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_40);
  if ((int)uVar1 < (int)sVar2) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_40);
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: too many resulting tokens: %d (max %d)\n",
               "whisper_tokenize",sVar2 & 0xffffffff,(ulong)local_24);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_40);
    local_4 = -(int)sVar2;
  }
  else {
    local_7c = 0;
    while( true ) {
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_40);
      if ((int)sVar2 <= local_7c) break;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_7c);
      *(value_type *)(local_20 + (long)local_7c * 4) = *pvVar3;
      local_7c = local_7c + 1;
    }
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_40);
    local_4 = (int)sVar2;
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_RSI);
  return local_4;
}

Assistant:

int whisper_tokenize(struct whisper_context * ctx, const char * text, whisper_token * tokens, int n_max_tokens) {
    const auto res = tokenize(ctx->vocab, text);

    if (n_max_tokens < (int) res.size()) {
        WHISPER_LOG_ERROR("%s: too many resulting tokens: %d (max %d)\n", __func__, (int) res.size(), n_max_tokens);
        return -(int) res.size();
    }

    for (int i = 0; i < (int) res.size(); i++) {
        tokens[i] = res[i];
    }

    return res.size();
}